

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5IterSetOutputCb(int *pRc,Fts5Iter *pIter)

{
  Fts5Config *pFVar1;
  Fts5Config *pConfig;
  Fts5Iter *pIter_local;
  int *pRc_local;
  
  if (*pRc == 0) {
    pFVar1 = pIter->pIndex->pConfig;
    if (pFVar1->eDetail == 1) {
      pIter->xSetOutputs = fts5IterSetOutputs_None;
    }
    else if (pIter->pColset == (Fts5Colset *)0x0) {
      pIter->xSetOutputs = fts5IterSetOutputs_Nocolset;
    }
    else if (pIter->pColset->nCol == 0) {
      pIter->xSetOutputs = fts5IterSetOutputs_ZeroColset;
    }
    else if (pFVar1->eDetail == 0) {
      pIter->xSetOutputs = fts5IterSetOutputs_Full;
    }
    else if (pFVar1->nCol < 0x65) {
      pIter->xSetOutputs = fts5IterSetOutputs_Col100;
      sqlite3Fts5BufferSize(pRc,&pIter->poslist,pFVar1->nCol);
    }
    else {
      pIter->xSetOutputs = fts5IterSetOutputs_Col;
    }
  }
  return;
}

Assistant:

static void fts5IterSetOutputCb(int *pRc, Fts5Iter *pIter){
  if( *pRc==SQLITE_OK ){
    Fts5Config *pConfig = pIter->pIndex->pConfig;
    if( pConfig->eDetail==FTS5_DETAIL_NONE ){
      pIter->xSetOutputs = fts5IterSetOutputs_None;
    }

    else if( pIter->pColset==0 ){
      pIter->xSetOutputs = fts5IterSetOutputs_Nocolset;
    }

    else if( pIter->pColset->nCol==0 ){
      pIter->xSetOutputs = fts5IterSetOutputs_ZeroColset;
    }

    else if( pConfig->eDetail==FTS5_DETAIL_FULL ){
      pIter->xSetOutputs = fts5IterSetOutputs_Full;
    }

    else{
      assert( pConfig->eDetail==FTS5_DETAIL_COLUMNS );
      if( pConfig->nCol<=100 ){
        pIter->xSetOutputs = fts5IterSetOutputs_Col100;
        sqlite3Fts5BufferSize(pRc, &pIter->poslist, pConfig->nCol);
      }else{
        pIter->xSetOutputs = fts5IterSetOutputs_Col;
      }
    }
  }
}